

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

Function * __thiscall soul::ModuleCloner::getRemappedFunction(ModuleCloner *this,Function *old)

{
  mapped_type *this_00;
  Function *pFVar1;
  key_type local_8;
  
  local_8.object = old;
  this_00 = std::__detail::
            _Map_base<soul::pool_ref<const_soul::heart::Function>,_std::pair<const_soul::pool_ref<const_soul::heart::Function>,_soul::pool_ptr<soul::heart::Function>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Function>,_soul::pool_ptr<soul::heart::Function>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::Function>_>,_std::hash<soul::pool_ref<const_soul::heart::Function>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<soul::pool_ref<const_soul::heart::Function>,_std::pair<const_soul::pool_ref<const_soul::heart::Function>,_soul::pool_ptr<soul::heart::Function>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::Function>,_soul::pool_ptr<soul::heart::Function>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::Function>_>,_std::hash<soul::pool_ref<const_soul::heart::Function>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)this->functionMappings,&local_8);
  pFVar1 = pool_ptr<soul::heart::Function>::operator*(this_00);
  return pFVar1;
}

Assistant:

heart::Function& getRemappedFunction (heart::Function& old)                 { return *functionMappings[old]; }